

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O3

string * __thiscall
pbrt::FloatTextureHandle::ToString_abi_cxx11_
          (string *__return_storage_ptr__,FloatTextureHandle *this)

{
  ulong uVar1;
  ushort uVar2;
  uint uVar3;
  char *pcVar4;
  FloatCheckerboardTexture *this_00;
  size_type __dnew;
  size_type local_20;
  
  uVar1 = (this->
          super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
          ).bits;
  this_00 = (FloatCheckerboardTexture *)(uVar1 & 0xffffffffffff);
  if (this_00 == (FloatCheckerboardTexture *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = 0x7274706c6c756e28;
    *(undefined2 *)((long)&__return_storage_ptr__->field_2 + 8) = 0x29;
    __return_storage_ptr__->_M_string_length = 9;
  }
  else {
    uVar2 = (ushort)(uVar1 >> 0x30);
    uVar3 = (uint)uVar2;
    if (uVar1 >> 0x30 < 7) {
      if (uVar1 >> 0x32 == 0) {
        if (uVar1 >> 0x31 == 0) {
          FloatImageTexture::ToString_abi_cxx11_
                    (__return_storage_ptr__,(FloatImageTexture *)this_00);
        }
        else if (uVar3 - 1 < 2) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          local_20 = 0x14;
          pcVar4 = (char *)std::__cxx11::string::_M_create
                                     ((ulong *)__return_storage_ptr__,(ulong)&local_20);
          (__return_storage_ptr__->_M_dataplus)._M_p = pcVar4;
          (__return_storage_ptr__->field_2)._M_allocated_capacity = local_20;
          builtin_strncpy(pcVar4,"GPUFloatImageTexture",0x14);
          __return_storage_ptr__->_M_string_length = local_20;
          (__return_storage_ptr__->_M_dataplus)._M_p[local_20] = '\0';
        }
        else {
          FloatMixTexture::ToString_abi_cxx11_(__return_storage_ptr__,(FloatMixTexture *)this_00);
        }
      }
      else if (uVar2 - 3 < 2) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        __return_storage_ptr__->_M_string_length = 0;
        (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
        detail::
        stringPrintfRecursive<pbrt::FloatTextureHandle_const&,pbrt::FloatTextureHandle_const&>
                  (__return_storage_ptr__,"[ FloatScaledTexture tex: %s scale: %s ]",
                   (FloatTextureHandle *)this_00,(FloatTextureHandle *)&this_00->map3D);
      }
      else if ((uVar3 & 6) == 4) {
        FloatConstantTexture::ToString_abi_cxx11_
                  (__return_storage_ptr__,(FloatConstantTexture *)this_00);
      }
      else {
        FloatBilerpTexture::ToString_abi_cxx11_
                  (__return_storage_ptr__,(FloatBilerpTexture *)this_00);
      }
    }
    else if (uVar2 - 6 < 4) {
      if (uVar2 - 6 < 2) {
        FloatCheckerboardTexture::ToString_abi_cxx11_(__return_storage_ptr__,this_00);
      }
      else if (uVar3 - 7 < 2) {
        FloatDotsTexture::ToString_abi_cxx11_(__return_storage_ptr__,(FloatDotsTexture *)this_00);
      }
      else {
        FBmTexture::ToString_abi_cxx11_(__return_storage_ptr__,(FBmTexture *)this_00);
      }
    }
    else if (uVar3 - 9 < 2) {
      FloatPtexTexture::ToString_abi_cxx11_(__return_storage_ptr__,(FloatPtexTexture *)this_00);
    }
    else if (uVar3 - 9 == 2) {
      WindyTexture::ToString_abi_cxx11_(__return_storage_ptr__,(WindyTexture *)this_00);
    }
    else {
      WrinkledTexture::ToString_abi_cxx11_(__return_storage_ptr__,(WrinkledTexture *)this_00);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FloatTextureHandle::ToString() const {
    if (ptr() == nullptr)
        return "(nullptr)";

    auto toStr = [](auto ptr) { return ptr->ToString(); };
    return DispatchCPU(toStr);
}